

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawColumnRt1CopyPalCommand::Execute
          (DrawColumnRt1CopyPalCommand *this,DrawerThread *thread)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint8_t *puVar4;
  long lVar5;
  uint8_t *puVar6;
  
  iVar3 = (this->super_PalRtCommand).yl;
  uVar1 = DrawerThread::count_for_thread(thread,iVar3,((this->super_PalRtCommand).yh - iVar3) + 1);
  if (0 < (int)uVar1) {
    iVar3 = (this->super_PalRtCommand).yl;
    iVar2 = DrawerThread::skipped_by_thread(thread,iVar3);
    puVar6 = (this->super_PalRtCommand)._destorg +
             (long)(this->super_PalRtCommand).sx + (long)(int)(&ylookup)[iVar2 + iVar3];
    puVar4 = thread->dc_temp;
    iVar3 = DrawerThread::temp_line_for_thread(thread,(this->super_PalRtCommand).yl);
    puVar4 = puVar4 + (long)*(int *)&(this->super_PalRtCommand).super_DrawerCommand.field_0xc +
                      (long)iVar3 * 4;
    lVar5 = (long)thread->num_cores * (long)(this->super_PalRtCommand)._pitch;
    if ((uVar1 & 1) != 0) {
      *puVar6 = *puVar4;
      puVar4 = puVar4 + 4;
      puVar6 = puVar6 + lVar5;
    }
    iVar3 = (int)lVar5;
    if ((uVar1 & 2) != 0) {
      *puVar6 = *puVar4;
      puVar6[lVar5] = puVar4[4];
      puVar4 = puVar4 + 8;
      puVar6 = puVar6 + iVar3 * 2;
    }
    if (3 < uVar1) {
      uVar1 = uVar1 >> 2;
      do {
        *puVar6 = *puVar4;
        puVar6[lVar5] = puVar4[4];
        puVar6[(long)iVar3 * 2] = puVar4[8];
        puVar6[(long)iVar3 * 3] = puVar4[0xc];
        puVar4 = puVar4 + 0x10;
        puVar6 = puVar6 + iVar3 * 4;
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
  }
  return;
}

Assistant:

void DrawColumnRt1CopyPalCommand::Execute(DrawerThread *thread)
	{
		uint8_t *source;
		uint8_t *dest;
		int count;
		int pitch;

		count = yh - yl + 1;

		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		dest = ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg;
		source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4 + hx];
		pitch = _pitch * thread->num_cores;

		if (count & 1) {
			*dest = *source;
			source += 4;
			dest += pitch;
		}
		if (count & 2) {
			dest[0] = source[0];
			dest[pitch] = source[4];
			source += 8;
			dest += pitch*2;
		}
		if (!(count >>= 2))
			return;

		do {
			dest[0] = source[0];
			dest[pitch] = source[4];
			dest[pitch*2] = source[8];
			dest[pitch*3] = source[12];
			source += 16;
			dest += pitch*4;
		} while (--count);
	}